

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

bool __thiscall
isotropic::scatter(isotropic *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  element_type *peVar1;
  double time;
  double local_98;
  double local_90;
  double local_88;
  vec3 local_80;
  ray local_68;
  ray *local_30;
  ray *scattered_local;
  color *attenuation_local;
  hit_record *rec_local;
  ray *r_in_local;
  isotropic *this_local;
  
  local_30 = scattered;
  scattered_local = (ray *)attenuation;
  attenuation_local = &rec->p;
  rec_local = (hit_record *)r_in;
  r_in_local = (ray *)this;
  random_unit_vector();
  ray::time((ray *)rec_local,(time_t *)r_in);
  ray::ray(&local_68,&rec->p,&local_80,time);
  memcpy(local_30,&local_68,0x38);
  peVar1 = std::__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tex);
  (*peVar1->_vptr_texture[2])
            (attenuation_local[3].e[0],attenuation_local[3].e[1],&local_98,peVar1,attenuation_local)
  ;
  (scattered_local->orig).e[0] = local_98;
  (scattered_local->orig).e[1] = local_90;
  (scattered_local->orig).e[2] = local_88;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        scattered = ray(rec.p, random_unit_vector(), r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }